

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodePtr xmlXPathNextPrecedingSibling(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr pxVar3;
  
  if ((((ctxt != (xmlXPathParserContextPtr)0x0) &&
       (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) &&
      ((pxVar1->node->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL)) &&
     (pxVar1->doc != (xmlDocPtr)cur)) {
    pxVar3 = pxVar1->node;
    if (cur != (xmlNodePtr)0x0) {
      pxVar2 = cur->prev;
      if (pxVar2 == (xmlNodePtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      pxVar3 = cur;
      if (pxVar2->type == XML_DTD_NODE) {
        pxVar3 = pxVar2;
      }
    }
    return pxVar3->prev;
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextPrecedingSibling(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
	(ctxt->context->node->type == XML_NAMESPACE_DECL))
	return(NULL);
    if (cur == (xmlNodePtr) ctxt->context->doc)
        return(NULL);
    if (cur == NULL)
        return(ctxt->context->node->prev);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE)) {
	cur = cur->prev;
	if (cur == NULL)
	    return(ctxt->context->node->prev);
    }
    return(cur->prev);
}